

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSqueezeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint32 uVar4;
  uint32 uVar5;
  SqueezeLayerParams *pSVar6;
  string *psVar7;
  int64 iVar8;
  Tensor *pTVar9;
  iterator iVar10;
  iterator __last;
  reference piVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined1 local_338 [8];
  string err_4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_308;
  int local_2fc;
  iterator iStack_2f8;
  int min_value;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2f0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2e8;
  int local_2dc;
  undefined1 local_2d8 [4];
  int max_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [8];
  string err_3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_260;
  int local_258;
  int local_254;
  int a_1;
  int i_1;
  vector<int,_std::allocator<int>_> axes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  string err_2;
  int axes_length;
  int output_rank;
  int input_rank;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [8];
  string err_1;
  _Self local_150;
  key_type_conflict1 local_148;
  int local_144;
  int a;
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> axes_set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string err;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    validateOutputCount((Result *)((long)&err.field_2 + 8),
                        (NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
    Result::operator=((Result *)local_48,(Result *)((long)&err.field_2 + 8));
    Result::~Result((Result *)((long)&err.field_2 + 8));
  }
  pSVar6 = Specification::NeuralNetworkLayer::squeeze
                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  bVar1 = Specification::SqueezeLayerParams::squeezeall(pSVar6);
  if (!bVar1) {
    pSVar6 = Specification::NeuralNetworkLayer::squeeze
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    iVar2 = Specification::SqueezeLayerParams::axes_size(pSVar6);
    if (iVar2 == 0) {
      psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      std::__cxx11::string::string((string *)&local_108,(string *)psVar7);
      std::operator+(&local_e8,"Squeeze Layer \'",&local_108);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     &local_e8,"\': length of the \'axes\' parameter cannot be 0.");
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c8);
      axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_c8);
      goto LAB_00a406c7;
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&a);
    local_144 = 0;
    while( true ) {
      iVar2 = local_144;
      pSVar6 = Specification::NeuralNetworkLayer::squeeze
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      iVar3 = Specification::SqueezeLayerParams::axes_size(pSVar6);
      if (iVar3 <= iVar2) break;
      pSVar6 = Specification::NeuralNetworkLayer::squeeze
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      iVar8 = Specification::SqueezeLayerParams::axes(pSVar6,local_144);
      local_148 = (key_type_conflict1)iVar8;
      local_150._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)&a,&local_148);
      err_1.field_2._8_8_ =
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)&a);
      bVar1 = std::operator!=(&local_150,(_Self *)((long)&err_1.field_2 + 8));
      if (bVar1) {
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::__cxx11::string::string((string *)&local_1b8,(string *)psVar7);
        std::operator+(&local_198,"Squeeze Layer \'",&local_1b8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_178,&local_198,
                       "\': all the values in the \'axes\' parameter must be unique.");
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_178);
        axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_178);
        goto LAB_00a40685;
      }
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&a,&local_148);
      local_144 = local_144 + 1;
    }
    iVar2 = Specification::NeuralNetworkLayer::inputtensor_size
                      ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    if ((iVar2 < 1) ||
       (iVar2 = Specification::NeuralNetworkLayer::outputtensor_size
                          ((NeuralNetworkLayer *)r.m_message.field_2._8_8_), iVar2 < 1)) {
LAB_00a4067b:
      axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
    }
    else {
      pTVar9 = Specification::NeuralNetworkLayer::inputtensor
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,0);
      uVar4 = Specification::Tensor::rank(pTVar9);
      pTVar9 = Specification::NeuralNetworkLayer::outputtensor
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,0);
      uVar5 = Specification::Tensor::rank(pTVar9);
      pSVar6 = Specification::NeuralNetworkLayer::squeeze
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      err_2.field_2._12_4_ = Specification::SqueezeLayerParams::axes_size(pSVar6);
      if ((uVar4 == 1) || (uVar5 + err_2.field_2._12_4_ == uVar4)) {
        std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&a_1);
        for (local_254 = 0; local_254 < (int)err_2.field_2._12_4_; local_254 = local_254 + 1) {
          pSVar6 = Specification::NeuralNetworkLayer::squeeze
                             ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
          iVar8 = Specification::SqueezeLayerParams::axes(pSVar6,local_254);
          local_258 = (int)iVar8;
          if (local_258 < 0) {
            local_258 = uVar4 + local_258;
          }
          iVar10 = std::vector<int,_std::allocator<int>_>::begin
                             ((vector<int,_std::allocator<int>_> *)&a_1);
          __last = std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)&a_1);
          local_260 = std::
                      find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                                (iVar10._M_current,__last._M_current,&local_258);
          err_3.field_2._8_8_ =
               std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)&a_1);
          bVar1 = __gnu_cxx::operator!=
                            (&local_260,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             ((long)&err_3.field_2 + 8));
          if (bVar1) {
            psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                               ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
            std::__cxx11::string::string((string *)local_2d8,(string *)psVar7);
            std::operator+(&local_2b8,"Squeeze Layer \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2d8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_298,&local_2b8,
                           "\': axes parameter list cannot have the same value more than once.");
            std::__cxx11::string::~string((string *)&local_2b8);
            std::__cxx11::string::~string((string *)local_2d8);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_298);
            axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
            std::__cxx11::string::~string((string *)local_298);
            goto LAB_00a40653;
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&a_1,&local_258);
        }
        local_2f0._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)&a_1);
        iStack_2f8 = std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)&a_1);
        local_2e8 = std::
                    max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              (local_2f0,iStack_2f8._M_current);
        piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&local_2e8);
        local_2dc = *piVar11;
        iVar10 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)&a_1);
        err_4.field_2._8_8_ =
             std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&a_1);
        local_308 = std::
                    min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              (iVar10._M_current,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                               err_4.field_2._8_8_);
        piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&local_308);
        local_2fc = *piVar11;
        if (((int)(uVar4 - 1) < local_2dc) || (local_2fc < 0)) {
          psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
          std::__cxx11::string::string((string *)&local_378,(string *)psVar7);
          std::operator+(&local_358,"Squeeze Layer \'",&local_378);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_338,&local_358,
                         "\': axes refers to a dimension that exceeds the input rank.");
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::~string((string *)&local_378);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_338);
          axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
          std::__cxx11::string::~string((string *)local_338);
        }
        else {
          axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
        }
LAB_00a40653:
        std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&a_1);
        if (axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) goto LAB_00a4067b;
      }
      else {
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::__cxx11::string::string
                  ((string *)
                   &axes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(string *)psVar7);
        std::operator+(&local_218,"Squeeze Layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &axes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8,&local_218,
                       "\': output rank plus the length of the axes parameter must equal input rank."
                      );
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string
                  ((string *)
                   &axes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1f8);
        axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_1f8);
      }
    }
LAB_00a40685:
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&a);
    if (axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0) goto LAB_00a406c7;
  }
  Result::Result(__return_storage_ptr__,(Result *)local_48);
  axes_set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
LAB_00a406c7:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSqueezeLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!layer.squeeze().squeezeall()) {

        if (layer.squeeze().axes_size() == 0) {
            std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': length of the 'axes' parameter cannot be 0.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }

        // either all values in axes must be positive or all negative
        std::set<int> axes_set;
        for (int i=0; i<layer.squeeze().axes_size(); i++) {
            int a = (int)layer.squeeze().axes(i);
            if (axes_set.find(a) != axes_set.end()) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': all the values in the 'axes' parameter must be unique.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            } else {
                axes_set.insert(a);
            }
        }

        if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
            int input_rank = static_cast<int>(layer.inputtensor(0).rank());
            int output_rank = static_cast<int>(layer.outputtensor(0).rank());
            int axes_length = layer.squeeze().axes_size();

            if (input_rank != 1) {
                if (output_rank + axes_length != input_rank) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': output rank plus the length of the axes parameter must equal input rank.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }

            std::vector<int> axes;
            for (int i=0; i<axes_length; i++) {
                int a = (int)layer.squeeze().axes(i);
                if (a < 0) {
                    a = input_rank + a;
                }
                if (std::find(axes.begin(), axes.end(), a) != axes.end()) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes parameter list cannot have the same value more than once.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                axes.push_back(a);
            }

            int max_value = *std::max_element(axes.begin(), axes.end());
            int min_value = *std::min_element(axes.begin(), axes.end());
            if (max_value > input_rank - 1 || min_value < 0) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes refers to a dimension that exceeds the input rank.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return r;
}